

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_equals_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  
  lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar4 + 4) & 0x20) == 0) {
    iVar3 = container1->n_runs;
    lVar4 = (long)iVar3;
    if (0 < lVar4) {
      lVar6 = 0;
      do {
        iVar3 = iVar3 + (uint)container1->runs[lVar6].length;
        lVar6 = lVar6 + 1;
      } while (lVar4 != lVar6);
    }
  }
  else {
    iVar3 = _avx2_run_container_cardinality(container1);
  }
  if (iVar3 == container2->cardinality) {
    uVar5 = (ulong)container1->n_runs;
    bVar2 = (long)uVar5 < 1;
    if (0 < (long)uVar5) {
      uVar7 = 0;
      iVar3 = 0;
      do {
        uVar1 = container1->runs[uVar7].value;
        if ((container2->array[iVar3] == uVar1) &&
           (uVar8 = (uint)container1->runs[uVar7].length,
           uVar1 + uVar8 == (uint)container2->array[iVar3 + uVar8])) {
          iVar3 = iVar3 + uVar8 + 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        if (!bVar2) goto LAB_0010cf54;
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      bVar2 = uVar5 <= uVar7;
    }
  }
  else {
LAB_0010cf54:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool run_container_equals_array(const run_container_t* container1,
                                const array_container_t* container2) {
    if (run_container_cardinality(container1) != container2->cardinality)
        return false;
    int32_t pos = 0;
    for (int i = 0; i < container1->n_runs; ++i) {
        const uint32_t run_start = container1->runs[i].value;
        const uint32_t le = container1->runs[i].length;

        if (container2->array[pos] != run_start) {
            return false;
        }

        if (container2->array[pos + le] != run_start + le) {
            return false;
        }

        pos += le + 1;
    }
    return true;
}